

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

void __thiscall masc::polygon::c_ply::reverse(c_ply *this)

{
  int iVar1;
  undefined4 extraout_var;
  ply_vertex *local_18;
  ply_vertex *ptr;
  c_ply *this_local;
  
  local_18 = this->head;
  do {
    ply_vertex::reverse(local_18);
    iVar1 = (*local_18->_vptr_ply_vertex[3])();
    local_18 = (ply_vertex *)CONCAT44(extraout_var,iVar1);
  } while (local_18 != this->head);
  this->area = -this->area;
  std::vector<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::clear
            (&this->all);
  return;
}

Assistant:

void c_ply::reverse()
{
    ply_vertex * ptr=head;
    do{
        ptr->reverse();
        ptr=ptr->getNext();
    }
    while(ptr!=head); //end while

    this->area=-this->area;
    all.clear();
}